

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O2

void __thiscall tst_qpromise_resolve::value(tst_qpromise_resolve *this)

{
  QSharedData *pQVar1;
  PromiseDataBase<int,_void_(const_int_&)> *pPVar2;
  bool bVar3;
  char cVar4;
  PromiseData<void> *this_00;
  long lVar5;
  char *in_R8;
  long lVar6;
  PromiseResolver<void> resolver;
  int value;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_148;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_138;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_130;
  QPromiseBase<int> local_128;
  _func_int **local_118;
  PromiseData<int> *local_110;
  _func_int **local_108;
  PromiseData<int> *local_100;
  QPromiseBase<void> local_f8;
  int v1;
  QPromiseBase<void> local_e0;
  int *local_d0;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<int> p0;
  QPromiseBase<void> local_98;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _func_int **local_68;
  undefined **local_60;
  int v0;
  _Any_data local_50 [2];
  
  v1 = 0x2a;
  local_128._vptr_QPromiseBase = (_func_int **)CONCAT44(local_128._vptr_QPromiseBase._4_4_,0x2a);
  v0 = v1;
  QtPromise::QPromise<int>::resolve(&p0,(int *)&local_128);
  QtPromise::QPromise<int>::resolve(&p1,&v0);
  QtPromise::QPromise<int>::resolve(&p2,&v1);
  local_128.m_d.d = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a8b0;
  local_110 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = (_func_int **)&PTR__QPromiseBase_0011a8b0;
  local_60 = &PTR__QPromiseBase_0011a6e8;
  local_100 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (_func_int **)&PTR__QPromiseBase_0011a8b0;
  local_108 = (_func_int **)&PTR__QPromiseBase_0011a8b0;
  lVar6 = 0;
  do {
    lVar5 = lVar6;
    if (lVar5 == 0x30) break;
    bVar3 = QtPromise::QPromiseBase<int>::isFulfilled
                      ((QPromiseBase<int> *)((long)&local_128._vptr_QPromiseBase + lVar5));
    local_88._M_pod_data[0] = bVar3;
    local_50[0]._M_pod_data[0] = '\x01';
    in_R8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
    ;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)local_88._M_pod_data,(bool *)local_50[0]._M_pod_data,
                       "p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                       ,0x2e);
    lVar6 = lVar5 + 0x10;
  } while (bVar3);
  lVar6 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase
              ((QPromiseBase<int> *)((long)&local_128._vptr_QPromiseBase + lVar6));
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -0x10);
  if (lVar5 == 0x30) {
    local_128.m_d.d = p0.super_QPromiseBase<int>.m_d.d;
    if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128._vptr_QPromiseBase = local_68;
    local_110 = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118 = local_68;
    local_100 = p2.super_QPromiseBase<int>.m_d.d;
    if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108 = local_68;
    lVar6 = 8;
    do {
      if (lVar6 == 0x38) break;
      value = -1;
      local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a760;
      this_00 = (PromiseData<void> *)operator_new(0x58);
      (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_lock = 0;
      *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_settled = 0;
      (this_00->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
      (this_00->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
           (void *)0x0;
      QtPromisePrivate::PromiseData<void>::PromiseData(this_00);
      LOCK();
      pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (this_00 != (PromiseData<void> *)0x0) {
        LOCK();
        pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a718;
      local_f8.m_d.d = this_00;
      local_98.m_d.d = this_00;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver,(QPromise<void> *)&local_98);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_98);
      if (resolver.m_d.d == (Data *)0x0) {
        local_130.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
        local_130 = resolver.m_d.d;
      }
      local_138.d = (Data *)0x0;
      if (local_130.d == (Data *)0x0) {
        local_140.d = (Data *)0x0;
      }
      else {
        LOCK();
        ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_140.d = local_130.d;
      }
      local_148.d = (Data *)0x0;
      pPVar2 = *(PromiseDataBase<int,_void_(const_int_&)> **)
                ((long)&local_128._vptr_QPromiseBase + lVar6);
      if (local_130.d != (Data *)0x0) {
        LOCK();
        ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_140.d != (Data *)0x0) {
        LOCK();
        ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_d0 = &value;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (_Manager_type)0x0;
      p_Stack_70 = (_Invoker_type)0x0;
      local_e0._vptr_QPromiseBase = (_func_int **)local_130.d;
      local_e0.m_d.d = (PromiseData<void> *)local_140.d;
      local_88._M_unused._M_object = operator_new(0x18);
      *(_func_int ***)local_88._M_unused._0_8_ = local_e0._vptr_QPromiseBase;
      if ((Data *)local_e0._vptr_QPromiseBase != (Data *)0x0) {
        LOCK();
        (((QSharedData *)local_e0._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QSharedData *)local_e0._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(PromiseData<void> **)((long)local_88._M_unused._0_8_ + 8) = local_e0.m_d.d;
      if ((Data *)local_e0.m_d.d != (Data *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_e0.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_e0.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase)->
               super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(int **)((long)local_88._M_unused._0_8_ + 0x10) = local_d0;
      p_Stack_70 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
      QtPromisePrivate::
      PromiseHandler<int,waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1},int_const&>
      ::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)&local_e0);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (pPVar2,(function<void_(const_int_&)> *)&local_88);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      pPVar2 = *(PromiseDataBase<int,_void_(const_int_&)> **)
                ((long)&local_128._vptr_QPromiseBase + lVar6);
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_50,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_130,
                 (QPromiseResolve<void> *)&local_140,(QPromiseReject<void> *)in_R8);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (pPVar2,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_50);
      std::_Function_base::~_Function_base((_Function_base *)local_50);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_140);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_148);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_130);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_138);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver.m_d);
      local_f8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011a718;
      bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (*(PromiseDataBase<int,_void_(const_int_&)> **)
                          ((long)&local_128._vptr_QPromiseBase + lVar6));
      if (!bVar3) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (*(PromiseDataBase<int,_void_(const_int_&)> **)
                    ((long)&local_128._vptr_QPromiseBase + lVar6));
      }
      QtPromise::QPromiseBase<void>::wait(&local_e0,&local_f8);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_e0);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_f8);
      in_R8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
      ;
      cVar4 = QTest::qCompare(value,0x2a,"waitForValue(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_resolve.cpp"
                              ,0x31);
      lVar6 = lVar6 + 0x10;
    } while (cVar4 != '\0');
    lVar6 = 0x20;
    do {
      QtPromise::QPromiseBase<int>::~QPromiseBase
                ((QPromiseBase<int> *)((long)&local_128._vptr_QPromiseBase + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -0x10);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p2.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_resolve::value()
{
    int v0 = 42;
    const int v1 = 42;

    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(v0);
    auto p2 = QtPromise::QPromise<int>::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<int>>::value));

    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(p.isFulfilled(), true);
    }
    for (const auto& p : {p0, p1, p2}) {
        QCOMPARE(waitForValue(p, -1), 42);
    }
}